

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void print_states(Grammar *g)

{
  State *pSVar1;
  Elem *pEVar2;
  Elem *ee;
  Action *pAVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  uint local_44;
  Grammar *local_40;
  ulong local_38;
  
  local_40 = g;
  for (local_38 = 0; local_38 < (local_40->states).n; local_38 = local_38 + 1) {
    pSVar1 = (local_40->states).v[local_38];
    local_44 = 0;
    pcVar6 = " ACCEPT";
    if ((pSVar1->field_0x178 & 1) == 0) {
      pcVar6 = "";
    }
    printf("STATE %d (%d ITEMS)%s\n",(ulong)pSVar1->index,(ulong)(pSVar1->items).n,pcVar6);
    for (uVar8 = 0; uVar8 < (pSVar1->items).n; uVar8 = uVar8 + 1) {
      pEVar2 = (pSVar1->items).v[uVar8];
      printf("\t%s: ",pEVar2->rule->prod->name);
      uVar7 = 0;
      bVar4 = true;
      while( true ) {
        if ((pEVar2->rule->elems).n <= uVar7) break;
        ee = (pEVar2->rule->elems).v[uVar7];
        if (ee == pEVar2) {
          bVar4 = false;
          printf(". ");
        }
        print_elem(ee);
        uVar7 = uVar7 + 1;
      }
      if (bVar4) {
        printf(". ");
      }
      putchar(10);
    }
    if ((pSVar1->gotos).n != 0) {
      puts("  GOTO");
    }
    for (uVar8 = 0; uVar8 < (pSVar1->gotos).n; uVar8 = uVar8 + 1) {
      putchar(9);
      print_elem((pSVar1->gotos).v[uVar8]->elem);
      printf(" : %d\n",(ulong)(pSVar1->gotos).v[uVar8]->state->index);
    }
    puts("  ACTION");
    for (uVar8 = 0; uVar8 < (pSVar1->reduce_actions).n; uVar8 = uVar8 + 1) {
      pAVar3 = (pSVar1->reduce_actions).v[uVar8];
      printf("\t%s\t",action_types[pAVar3->kind]);
      print_rule(pAVar3->rule);
      putchar(10);
    }
    for (uVar8 = 0; uVar8 < (pSVar1->shift_actions).n; uVar8 = uVar8 + 1) {
      pAVar3 = (pSVar1->shift_actions).v[uVar8];
      printf("\t%s\t",action_types[pAVar3->kind]);
      if (pAVar3->kind == ACTION_SHIFT) {
        print_term(pAVar3->term);
        printf("%d",(ulong)pAVar3->state->index);
      }
      putchar(10);
    }
    uVar5 = (pSVar1->reduce_actions).n;
    if (1 < uVar5) {
      print_conflict("reduce/reduce",&local_44);
      uVar5 = (pSVar1->reduce_actions).n;
    }
    if ((uVar5 != 0) && ((pSVar1->shift_actions).n != 0)) {
      print_conflict("shift/reduce",&local_44);
    }
    putchar(10);
  }
  return;
}

Assistant:

void print_states(Grammar *g) {
  uint i;

  for (i = 0; i < g->states.n; i++) print_state(g->states.v[i]);
}